

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAllExact(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char cVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  Bmc_EsPar_t *pPars;
  Bmc_EsPar_t Pars;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Bmc_EsParSetDefault((Bmc_EsPar_t *)&pPars);
  Extra_UtilGetoptReset();
LAB_00271f9e:
  do {
    Pars.pTtStr._4_4_ = Extra_UtilGetopt(argc,argv,"MINKiaoegvh");
    if (Pars.pTtStr._4_4_ == -1) {
      if (Pars.nNodes < 1) {
        if ((uint)pPars == 0) {
          Abc_Print(-1,
                    "The number of variables (-I num) needs to be specified on the command line.\n")
          ;
          return 1;
        }
        if (pPars._4_4_ == 0) {
          Abc_Print(-1,"The number of nodes (-N num) needs to be specified on the command line.\n");
          return 1;
        }
        if (argc == globalUtilOptind + 1) {
          Pars._48_8_ = argv[globalUtilOptind];
        }
        if (Pars._48_8_ == 0) {
          Abc_Print(-1,"Truth table should be given on the command line.\n");
          return 1;
        }
        cVar1 = (char)(uint)pPars;
        sVar3 = strlen((char *)Pars._48_8_);
        if (1 << (cVar1 - 2U & 0x1f) != (int)sVar3) {
          cVar1 = (char)(uint)pPars;
          sVar3 = strlen((char *)Pars._48_8_);
          Abc_Print(-1,"Truth table is expected to have %d hex digits (instead of %d).\n",
                    (ulong)(uint)(1 << (cVar1 - 2U & 0x1f)),sVar3);
          return 1;
        }
      }
      else {
        if (((Pars.nNodes != 5) && (Pars.nNodes != 7)) && (Pars.nNodes != 9)) {
          Abc_Print(-1,"Currently only support majority with 5, 7 or 9 inputs.\n");
          return 1;
        }
        pPars._0_4_ = Pars.nNodes;
        Pars.nVars = 3;
        Pars.nLutSize = 1;
        Pars.nMajSupp = 1;
        if (pPars._4_4_ == 0) {
          if (Pars.nNodes == 5) {
            pPars._4_4_ = 4;
          }
          if (Pars.nNodes == 7) {
            pPars._4_4_ = 7;
          }
          if (Pars.nNodes == 9) {
            pPars._4_4_ = 10;
          }
        }
      }
      if ((int)(pPars._4_4_ * (Pars.nVars + -1) + 1) < (int)(uint)pPars) {
        Abc_Print(-1,"Function with %d variales cannot be implemented with %d %d-input LUTs.\n",
                  (ulong)(uint)pPars,(ulong)pPars._4_4_,(ulong)(uint)Pars.nVars);
        return 1;
      }
      if ((int)(uint)pPars < 0xb) {
        if (6 < Pars.nVars) {
          Abc_Print(-1,"Node size should not be more than 6 inputs.\n");
          return 1;
        }
        if (Pars.nMajSupp == 0) {
          if (Pars.nLutSize != 0) {
            Abc_Print(-1,"Cannot synthesize majority in the non-incremental mode (use \'-i\').\n");
            return 1;
          }
          if (3 < Pars.nVars) {
            Abc_Print(-1,"Cannot synthesize LUT4 and larger in non-incremental mode (use \'-i\').\n"
                     );
            return 1;
          }
        }
        Zyx_ManExactSynthesis((Bmc_EsPar_t *)&pPars);
        return 0;
      }
      Abc_Print(-1,"Function should not have more than 10 inputs.\n");
      return 1;
    }
    switch(Pars.pTtStr._4_4_) {
    case 0x49:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
        goto LAB_00272501;
      }
      pPars._0_4_ = atoi(argv[globalUtilOptind]);
      uVar2 = (uint)pPars;
      break;
    default:
      goto LAB_00272501;
    case 0x4b:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-K\" should be followed by an integer.\n");
        goto LAB_00272501;
      }
      Pars.nVars = atoi(argv[globalUtilOptind]);
      uVar2 = Pars.nVars;
      break;
    case 0x4d:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
        goto LAB_00272501;
      }
      Pars.nNodes = atoi(argv[globalUtilOptind]);
      uVar2 = Pars.nNodes;
      break;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
        goto LAB_00272501;
      }
      pPars._4_4_ = atoi(argv[globalUtilOptind]);
      uVar2 = pPars._4_4_;
      break;
    case 0x61:
      Pars.fMajority = Pars.fMajority ^ 1;
      goto LAB_00271f9e;
    case 0x65:
      Pars.fGlucose = Pars.fGlucose ^ 1;
      goto LAB_00271f9e;
    case 0x67:
      Pars.fUseIncr = Pars.fUseIncr ^ 1;
      goto LAB_00271f9e;
    case 0x68:
      goto LAB_00272501;
    case 0x69:
      Pars.nMajSupp = Pars.nMajSupp ^ 1;
      goto LAB_00271f9e;
    case 0x6f:
      Pars.fOnlyAnd = Pars.fOnlyAnd ^ 1;
      goto LAB_00271f9e;
    case 0x76:
      Pars.fFewerVars = Pars.fFewerVars ^ 1;
      goto LAB_00271f9e;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar2 < 0) {
LAB_00272501:
      Abc_Print(-2,"usage: allexact [-MIKN <num>] [-iaoevh] <hex>\n");
      Abc_Print(-2,"\t           exact synthesis of I-input function using N K-input gates\n");
      Abc_Print(-2,"\t-M <num> : the majority support size (overrides -I and -K) [default = %d]\n",
                (ulong)(uint)Pars.nNodes);
      Abc_Print(-2,"\t-I <num> : the number of input variables [default = %d]\n",(ulong)(uint)pPars)
      ;
      Abc_Print(-2,"\t-K <num> : the number of node fanins [default = %d]\n",(ulong)(uint)Pars.nVars
               );
      Abc_Print(-2,"\t-N <num> : the number of K-input nodes [default = %d]\n",(ulong)pPars._4_4_);
      pcVar4 = "no";
      if (Pars.nMajSupp != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-i       : toggle using incremental solving [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Pars.fMajority != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-a       : toggle using only AND-gates when K = 2 [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Pars.fOnlyAnd != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-o       : toggle using node ordering by fanins [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Pars.fGlucose != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-e       : toggle enumerating all solutions [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Pars.fFewerVars != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h       : print the command usage\n");
      Abc_Print(-2,"\t<hex>    : truth table in hex notation\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAllExact( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Zyx_ManExactSynthesis( Bmc_EsPar_t * pPars );
    int c;
    Bmc_EsPar_t Pars, * pPars = &Pars;
    Bmc_EsParSetDefault( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "MINKiaoegvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nMajSupp = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nMajSupp < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nVars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nVars < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nNodes = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nNodes < 0 )
                goto usage;
            break;
       case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutSize < 0 )
                goto usage;
            break;
        case 'i':
            pPars->fUseIncr ^= 1;
            break;
        case 'a':
            pPars->fOnlyAnd ^= 1;
            break;
        case 'o':
            pPars->fOrderNodes ^= 1;
            break;
        case 'e':
            pPars->fEnumSols ^= 1;
            break;
        case 'g':
            pPars->fGlucose ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pPars->nMajSupp > 0 )
    {
        if ( pPars->nMajSupp != 5 && pPars->nMajSupp != 7 && pPars->nMajSupp != 9 )
        {
            Abc_Print( -1, "Currently only support majority with 5, 7 or 9 inputs.\n" );
            return 1;
        }
        pPars->nVars = pPars->nMajSupp;
        pPars->nLutSize = 3;
        pPars->fMajority = 1;
        pPars->fUseIncr = 1;
        if ( pPars->nNodes == 0 )
        {
            if ( pPars->nMajSupp == 5 )
                pPars->nNodes = 4;
            if ( pPars->nMajSupp == 7 )
                pPars->nNodes = 7;
            if ( pPars->nMajSupp == 9 )
                pPars->nNodes = 10;
        }
    }
    else
    {
        if ( pPars->nVars == 0 )
        {
            Abc_Print( -1, "The number of variables (-I num) needs to be specified on the command line.\n" );
            return 1;
        }
        if ( pPars->nNodes == 0 )
        {
            Abc_Print( -1, "The number of nodes (-N num) needs to be specified on the command line.\n" );
            return 1;
        }
        if ( argc == globalUtilOptind + 1 )
            pPars->pTtStr = argv[globalUtilOptind];
        if ( pPars->pTtStr == NULL )
        {
            Abc_Print( -1, "Truth table should be given on the command line.\n" );
            return 1;
        }
        if ( (1 << (pPars->nVars-2)) != (int)strlen(pPars->pTtStr) )
        {
            Abc_Print( -1, "Truth table is expected to have %d hex digits (instead of %d).\n", (1 << (pPars->nVars-2)), strlen(pPars->pTtStr) );
            return 1;
        }
    }
    if ( pPars->nVars > pPars->nNodes * (pPars->nLutSize - 1) + 1 )
    {
        Abc_Print( -1, "Function with %d variales cannot be implemented with %d %d-input LUTs.\n", pPars->nVars, pPars->nNodes, pPars->nLutSize );
        return 1;
    }
    if ( pPars->nVars > 10 )
    {
        Abc_Print( -1, "Function should not have more than 10 inputs.\n" );
        return 1;
    }
    if ( pPars->nLutSize > 6 )
    {
        Abc_Print( -1, "Node size should not be more than 6 inputs.\n" );
        return 1;
    }
    if ( !pPars->fUseIncr )
    {
        if ( pPars->fMajority )
        {
            Abc_Print( -1, "Cannot synthesize majority in the non-incremental mode (use \'-i\').\n" );
            return 1;
        }
        if ( pPars->nLutSize > 3 )
        {
            Abc_Print( -1, "Cannot synthesize LUT4 and larger in non-incremental mode (use \'-i\').\n" );
            return 1;
        }
    }
    Zyx_ManExactSynthesis( pPars );
    return 0;

usage:
    Abc_Print( -2, "usage: allexact [-MIKN <num>] [-iaoevh] <hex>\n" );
    Abc_Print( -2, "\t           exact synthesis of I-input function using N K-input gates\n" );
    Abc_Print( -2, "\t-M <num> : the majority support size (overrides -I and -K) [default = %d]\n", pPars->nMajSupp );
    Abc_Print( -2, "\t-I <num> : the number of input variables [default = %d]\n", pPars->nVars );
    Abc_Print( -2, "\t-K <num> : the number of node fanins [default = %d]\n", pPars->nLutSize );
    Abc_Print( -2, "\t-N <num> : the number of K-input nodes [default = %d]\n", pPars->nNodes );
    Abc_Print( -2, "\t-i       : toggle using incremental solving [default = %s]\n", pPars->fUseIncr ? "yes" : "no" );
    Abc_Print( -2, "\t-a       : toggle using only AND-gates when K = 2 [default = %s]\n", pPars->fOnlyAnd ? "yes" : "no" );
    Abc_Print( -2, "\t-o       : toggle using node ordering by fanins [default = %s]\n", pPars->fOrderNodes ? "yes" : "no" );
    Abc_Print( -2, "\t-e       : toggle enumerating all solutions [default = %s]\n", pPars->fEnumSols ? "yes" : "no" );
//    Abc_Print( -2, "\t-g       : toggle using Glucose 3.0 by Gilles Audemard and Laurent Simon [default = %s]\n", pPars->fGlucose ? "yes" : "no" );
    Abc_Print( -2, "\t-v       : toggle verbose printout [default = %s]\n", pPars->fVerbose ? "yes" : "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n" );
    Abc_Print( -2, "\t<hex>    : truth table in hex notation\n" );
    return 1;
}